

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordCalc.cpp
# Opt level: O2

string * __thiscall positionTy::dbgTxt_abi_cxx11_(string *__return_storage_ptr__,positionTy *this)

{
  posFlagsTy pVar1;
  ulong uVar2;
  undefined8 uVar3;
  string *psVar4;
  byte bVar5;
  char *pcVar6;
  char cVar7;
  ulong uVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  allocator<char> local_149;
  char *local_148;
  double local_140;
  double local_138;
  double local_130;
  double local_128;
  string *local_120;
  string local_118;
  char buf [200];
  
  dVar12 = this->_ts;
  dVar13 = this->_lat;
  dVar15 = this->_alt / 0.3048;
  dVar14 = this->_lon;
  pVar1 = this->f;
  bVar5 = pVar1._1_1_ & 3;
  pcVar6 = "GND_UNKNOWN";
  if (bVar5 == 2) {
    pcVar6 = "GND_ON";
  }
  pcVar11 = "GND_OFF";
  if (bVar5 != 1) {
    pcVar11 = pcVar6;
  }
  bVar5 = pVar1._1_1_ >> 4 & 3;
  pcVar6 = "   ";
  if (bVar5 == 3) {
    pcVar6 = "RWY";
  }
  pcVar10 = "TXI";
  if (bVar5 != 2) {
    pcVar10 = pcVar6;
  }
  pcVar9 = "SUP";
  if (bVar5 != 1) {
    pcVar9 = pcVar10;
  }
  pcVar10 = "CT";
  if (((ushort)pVar1 >> 0xe & 1) == 0) {
    pcVar10 = "  ";
  }
  cVar7 = pVar1._0_1_;
  local_120 = __return_storage_ptr__;
  if (((ushort)pVar1 & 0x7f) == 0) {
    local_148 = "";
  }
  else {
    local_140 = dVar14;
    local_138 = dVar15;
    local_130 = dVar13;
    local_128 = dVar12;
    LTAircraft::FlightPhase2String_abi_cxx11_
              (&local_118,(LTAircraft *)(ulong)((ushort)pVar1 & 0x7f),(flightPhaseE)pcVar6);
    local_148 = local_118._M_dataplus._M_p;
    cVar7 = SUB21(this->f,0);
    dVar12 = local_128;
    dVar13 = local_130;
    dVar14 = local_140;
    dVar15 = local_138;
  }
  uVar2 = this->edgeIdx;
  uVar8 = 0;
  if (uVar2 < 0xfffffffffffffffe) {
    uVar8 = uVar2;
  }
  uVar3 = 0x2a;
  if (-1 < cVar7) {
    uVar3 = 0x20;
  }
  snprintf(buf,200,
           "%.1f: (%7.5f, %7.5f) %7.1fft %8.8s %3.3s %2.2s %-13.13s %4.*zu {h %3.0f%c, p %3.0f, r %3.0f}"
           ,dVar12,dVar13,dVar14,dVar15,this->_head,this->_pitch,this->_roll,pcVar11,pcVar9,pcVar10,
           local_148,(ulong)(uVar2 < 0xfffffffffffffffe),uVar8,uVar3);
  if (((ushort)pVar1 & 0x7f) != 0) {
    std::__cxx11::string::~string((string *)&local_118);
  }
  psVar4 = local_120;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_120,buf,&local_149);
  return psVar4;
}

Assistant:

std::string positionTy::dbgTxt () const
{
    char buf[200];
    snprintf(buf, sizeof(buf), "%.1f: (%7.5f, %7.5f) %7.1fft %8.8s %3.3s %2.2s %-13.13s %4.*zu {h %3.0f%c, p %3.0f, r %3.0f}",
             ts(),
             lat(), lon(),
             alt_ft(),
             GrndE2String(f.onGrnd),
             SpecialPosE2String(f.specialPos),
             f.bCutCorner ? "CT" : "  ",
             f.flightPhase ? (LTAircraft::FlightPhase2String(f.flightPhase)).c_str() : "",
             HasTaxiEdge() ? 1 : 0,
             HasTaxiEdge() ? edgeIdx : 0,
             heading(),
             (f.bHeadFixed ? '*' : ' '),
             pitch(), roll());
    return std::string(buf);
}